

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_file_errorfn(arg_file *parent,FILE *fp,int errorcode,char *argval,char *progname)

{
  char *shortopts;
  char *longopts;
  char *pcVar1;
  char *datatype;
  
  shortopts = (parent->hdr).shortopts;
  longopts = (parent->hdr).longopts;
  pcVar1 = (parent->hdr).datatype;
  datatype = "";
  if (argval != (char *)0x0) {
    datatype = argval;
  }
  fprintf((FILE *)fp,"%s: ",progname);
  if (errorcode == 2) {
    fputs("excess option ",(FILE *)fp);
  }
  else {
    if (errorcode != 1) {
      fprintf((FILE *)fp,"unknown error at \"%s\"\n",datatype);
      return;
    }
    fputs("missing option ",(FILE *)fp);
    datatype = pcVar1;
  }
  arg_print_option(fp,shortopts,longopts,datatype,"\n");
  return;
}

Assistant:

static void arg_file_errorfn(
	struct arg_file * parent,
	FILE * fp,
	int errorcode,
	const char * argval,
	const char * progname) {
	const char * shortopts = parent->hdr.shortopts;
	const char * longopts  = parent->hdr.longopts;
	const char * datatype  = parent->hdr.datatype;

	/* make argval NULL safe */
	argval = argval ? argval : "";

	fprintf(fp, "%s: ", progname);

	switch (errorcode) {
		case EMINCOUNT:
			fputs("missing option ", fp);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			break;

		case EMAXCOUNT:
			fputs("excess option ", fp);
			arg_print_option(fp, shortopts, longopts, argval, "\n");
			break;

		default:
			fprintf(fp, "unknown error at \"%s\"\n", argval);
	}
}